

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O0

void CoreML::Specification::CoreMLModels::protobuf_VisionFeaturePrint_2eproto::TableStruct::Shutdown
               (void)

{
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene> *
             )_VisionFeaturePrint_Scene_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects>
              *)_VisionFeaturePrint_Objects_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::CoreMLModels::VisionFeaturePrint>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::CoreMLModels::VisionFeaturePrint> *)
             _VisionFeaturePrint_default_instance_);
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _VisionFeaturePrint_Scene_default_instance_.Shutdown();
  _VisionFeaturePrint_Objects_default_instance_.Shutdown();
  _VisionFeaturePrint_default_instance_.Shutdown();
}